

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O2

void ccall_classify_ct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  uint uVar1;
  CTSize CVar2;
  CType *pCVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = ct->info;
  if (uVar1 >> 0x1c == 1) {
    ccall_classify_struct(cts,ct,rcl,ofs);
    return;
  }
  if (uVar1 >> 0x1c == 3) {
    pCVar3 = cts->tab;
    CVar2 = pCVar3[uVar1 & 0xffff].size;
    uVar4 = ct->size;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + CVar2) {
      ccall_classify_ct(cts,pCVar3 + (uVar1 & 0xffff),rcl,ofs + uVar5);
    }
  }
  else {
    uVar4 = 4;
    if ((ct->size - 1 & ofs) == 0) {
      uVar4 = ((uVar1 & 0xf4000000) == 0x4000000) + 1;
    }
    rcl[7 < ofs] = rcl[7 < ofs] | uVar4;
  }
  return;
}

Assistant:

static void ccall_classify_ct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ctype_isarray(ct->info)) {
    CType *cct = ctype_rawchild(cts, ct);
    CTSize eofs, esz = cct->size, asz = ct->size;
    for (eofs = 0; eofs < asz; eofs += esz)
      ccall_classify_ct(cts, cct, rcl, ofs+eofs);
  } else if (ctype_isstruct(ct->info)) {
    ccall_classify_struct(cts, ct, rcl, ofs);
  } else {
    int cl = ctype_isfp(ct->info) ? CCALL_RCL_SSE : CCALL_RCL_INT;
    lj_assertCTS(ctype_hassize(ct->info),
		 "classify ctype %08x without size", ct->info);
    if ((ofs & (ct->size-1))) cl = CCALL_RCL_MEM;  /* Unaligned. */
    rcl[(ofs >= 8)] |= cl;
  }
}